

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O0

int ffcdfl(fitsfile *fptr,int *status)

{
  int iVar1;
  int iVar2;
  long lVar3;
  int *in_RSI;
  int *in_RDI;
  char chbuff [2880];
  char chfill;
  LONGLONG filpos;
  int i;
  int nfill;
  char acStack_b78 [8];
  int *in_stack_fffffffffffff490;
  int in_stack_fffffffffffff49c;
  LONGLONG in_stack_fffffffffffff4a0;
  fitsfile *in_stack_fffffffffffff4a8;
  int *in_stack_fffffffffffff4d0;
  void *in_stack_fffffffffffff4d8;
  LONGLONG in_stack_fffffffffffff4e0;
  fitsfile *in_stack_fffffffffffff4e8;
  int *in_stack_fffffffffffff4f0;
  int *in_stack_fffffffffffff4f8;
  int in_stack_fffffffffffff504;
  fitsfile *in_stack_fffffffffffff508;
  char local_29;
  int local_20;
  int local_4;
  
  if (*in_RSI < 1) {
    if (*in_RDI != *(int *)(*(long *)(in_RDI + 2) + 0x54)) {
      ffmahd(in_stack_fffffffffffff508,in_stack_fffffffffffff504,in_stack_fffffffffffff4f8,
             in_stack_fffffffffffff4f0);
    }
    if (*(long *)(*(long *)(in_RDI + 2) + 0x3d8) == 0) {
      local_4 = *in_RSI;
    }
    else {
      lVar3 = *(long *)(*(long *)(in_RDI + 2) + 0x88) + *(long *)(*(long *)(in_RDI + 2) + 0x3d8) +
              *(long *)(*(long *)(in_RDI + 2) + 0x3e0);
      iVar1 = (int)((lVar3 + 0xb3f) / 0xb40) * 0xb40 - (int)lVar3;
      if (iVar1 == 0) {
        local_4 = *in_RSI;
      }
      else {
        ffmbyt(in_stack_fffffffffffff4a8,in_stack_fffffffffffff4a0,in_stack_fffffffffffff49c,
               in_stack_fffffffffffff490);
        iVar2 = ffgbyt(in_stack_fffffffffffff4e8,in_stack_fffffffffffff4e0,in_stack_fffffffffffff4d8
                       ,in_stack_fffffffffffff4d0);
        if (iVar2 < 1) {
          if (*(int *)(*(long *)(in_RDI + 2) + 0x58) == 1) {
            local_29 = ' ';
          }
          else {
            local_29 = '\0';
          }
          for (local_20 = 0; local_20 < iVar1; local_20 = local_20 + 1) {
            if (acStack_b78[local_20] != local_29) {
              *in_RSI = 0xff;
              if (*(int *)(*(long *)(in_RDI + 2) + 0x58) == 1) {
                ffpmsg((char *)0x18b2af);
              }
              else {
                ffpmsg((char *)0x18b2bd);
              }
              return *in_RSI;
            }
          }
          local_4 = *in_RSI;
        }
        else {
          ffpmsg((char *)0x18b216);
          local_4 = *in_RSI;
        }
      }
    }
  }
  else {
    local_4 = *in_RSI;
  }
  return local_4;
}

Assistant:

int ffcdfl( fitsfile *fptr, int *status)
{
   int nfill,i;
   LONGLONG filpos;
   char chfill,chbuff[2880];

   if( *status > 0 ) return( *status );

    /* reset position to the correct HDU if necessary */
    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

   /*   check if the data unit is null   */
   if( (fptr->Fptr)->heapstart==0 ) return( *status );

   /* calculate starting position of the fill bytes, if any */
   filpos = (fptr->Fptr)->datastart 
          + (fptr->Fptr)->heapstart 
          + (fptr->Fptr)->heapsize;

   /*   calculate the number of fill bytes   */
   nfill = (long) ((filpos + 2879) / 2880 * 2880 - filpos);
   if( nfill == 0 ) return( *status );

   /*   move to the beginning of the fill bytes   */
   ffmbyt(fptr, filpos, FALSE, status);

   if( ffgbyt(fptr, nfill, chbuff, status) > 0)
   {
      ffpmsg("Error reading data unit fill bytes (ffcdfl).");
      return( *status );
   }

   if( (fptr->Fptr)->hdutype==ASCII_TBL )
      chfill = 32;         /* ASCII tables are filled with spaces */
   else
      chfill = 0;          /* all other extensions are filled with zeros */
   
   /*   check for all zeros or blanks   */
   
   for(i=0;i<nfill;i++) {
      if( chbuff[i] != chfill ) {
         *status=BAD_DATA_FILL;
         if( (fptr->Fptr)->hdutype==ASCII_TBL )
            ffpmsg("Warning: remaining bytes following ASCII table data are not filled with blanks.");
         else
            ffpmsg("Warning: remaining bytes following data are not filled with zeros.");
         return( *status );
      }
   }
   return( *status );
}